

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttachedPart.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::AttachedPart::AttachedPart
          (AttachedPart *this,KUINT8 DetachedIndicator,KUINT16 PartAttachedToID,KUINT32 APPT,
          EntityType *Type)

{
  EntityType *Type_local;
  KUINT32 APPT_local;
  KUINT16 PartAttachedToID_local;
  KUINT8 DetachedIndicator_local;
  AttachedPart *this_local;
  
  VariableParameter::VariableParameter(&this->super_VariableParameter);
  (this->super_VariableParameter).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__AttachedPart_0032f7e8;
  this->m_ui8DetachedIndicator = DetachedIndicator;
  this->m_ui16PartAttachedToID = PartAttachedToID;
  this->m_ui32APPT = APPT;
  EntityType::EntityType(&this->m_AttachedPartType,Type);
  (this->super_VariableParameter).m_ui8VarParamType = '\x01';
  return;
}

Assistant:

AttachedPart::AttachedPart( KUINT8 DetachedIndicator, KUINT16 PartAttachedToID, KUINT32 APPT, const EntityType & Type ) :
    m_ui8DetachedIndicator( DetachedIndicator ),
    m_ui16PartAttachedToID( PartAttachedToID ),
    m_ui32APPT( APPT ),
    m_AttachedPartType( Type )
{
    m_ui8VarParamType = AttachedPartType;
}